

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-poll.c
# Opt level: O3

void poll_cb(uv_poll_t *handle,int status,int events)

{
  int iVar1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  ssize_t sVar3;
  int *piVar4;
  char buffer [5];
  int fd;
  int local_2c;
  char local_28;
  int local_24;
  
  iVar1 = uv_fileno(handle,&stack0xffffffffffffffdc);
  if (iVar1 != 0) goto LAB_001673ca;
  local_28 = '\0';
  local_2c = 0;
  if ((events & 8U) != 0) {
    do {
      handle = (uv_poll_t *)(ulong)(uint)client_fd;
      sVar3 = recv(client_fd,&stack0xffffffffffffffd4,5,1);
      if ((int)sVar3 != -1) {
        if (-1 < (int)sVar3) goto LAB_00167195;
        piVar4 = __errno_location();
        iVar1 = *piVar4;
        break;
      }
      piVar4 = __errno_location();
      iVar1 = *piVar4;
    } while (iVar1 == 4);
    if (iVar1 == 0x16) goto LAB_001673d9;
LAB_00167195:
    cli_pr_check = 1;
    handle = poll_req;
    iVar1 = uv_poll_stop(poll_req);
    if (iVar1 != 0) goto LAB_001673cf;
    handle = poll_req;
    iVar1 = uv_poll_start(poll_req,3,poll_cb);
    if (iVar1 != 0) goto LAB_001673d4;
  }
  if ((events & 1U) == 0) goto LAB_00167381;
  if (local_24 != client_fd) goto LAB_0016730a;
  do {
    handle = (uv_poll_t *)(ulong)(uint)client_fd;
    sVar3 = recv(client_fd,&stack0xffffffffffffffd4,5,0);
    iVar1 = (int)sVar3;
    if (iVar1 != -1) {
      if (-1 < iVar1) goto LAB_0016722f;
      piVar4 = __errno_location();
      iVar2 = *piVar4;
      break;
    }
    piVar4 = __errno_location();
    iVar2 = *piVar4;
  } while (iVar2 == 4);
  if (iVar2 == 0x16) {
LAB_001673ef:
    poll_cb_cold_15();
LAB_001673f4:
    poll_cb_cold_10();
LAB_001673f9:
    poll_cb_cold_5();
LAB_001673fe:
    poll_cb_cold_11();
  }
  else {
LAB_0016722f:
    if (cli_rd_check != 0) {
      if (cli_rd_check != 1) {
LAB_0016730a:
        if (local_24 != server_fd) {
LAB_00167381:
          if ((events & 2U) != 0) {
            do {
              sVar3 = send(client_fd,"foo",3,0);
              iVar1 = (int)sVar3;
              if (-1 < iVar1) goto LAB_001673b5;
              piVar4 = __errno_location();
            } while (*piVar4 == 4);
            do {
              poll_cb_cold_16();
              iVar1 = extraout_EAX_00;
LAB_001673b5:
            } while (iVar1 != 3);
          }
          return;
        }
        do {
          handle = (uv_poll_t *)(ulong)(uint)server_fd;
          sVar3 = recv(server_fd,&stack0xffffffffffffffd4,3,0);
          iVar1 = (int)sVar3;
          if (iVar1 != -1) goto LAB_0016734b;
          piVar4 = __errno_location();
          iVar1 = *piVar4;
        } while (iVar1 == 4);
LAB_00167341:
        if (iVar1 != 0x16) {
LAB_001673c5:
          poll_cb_cold_13();
LAB_001673ca:
          poll_cb_cold_1();
LAB_001673cf:
          poll_cb_cold_2();
LAB_001673d4:
          poll_cb_cold_3();
LAB_001673d9:
          poll_cb_cold_4();
LAB_001673de:
          piVar4 = __errno_location();
          iVar1 = *piVar4;
          goto LAB_00167341;
        }
        poll_cb_cold_14();
        iVar1 = extraout_EAX;
LAB_0016734b:
        if (iVar1 < 0) goto LAB_001673de;
        if (iVar1 != 3) goto LAB_001673c5;
        if (local_2c._2_1_ == 'o' && (short)local_2c == 0x6f66) {
          srv_rd_check = 1;
          uv_poll_stop(0x3108d0);
          goto LAB_00167381;
        }
        poll_cb_cold_12();
        goto LAB_001673ef;
      }
      handle = (uv_poll_t *)&stack0xffffffffffffffd4;
      iVar2 = strncmp((char *)handle,"world",(long)iVar1);
      if (iVar2 != 0) goto LAB_001673f4;
      if (iVar1 == 5) {
        cli_rd_check = 2;
        goto LAB_0016730a;
      }
      goto LAB_001673fe;
    }
    if (iVar1 != 4) goto LAB_001673f9;
    if (local_2c == 0x6c6c6568) {
      iVar1 = 1;
      do {
        while( true ) {
          cli_rd_check = iVar1;
          handle = (uv_poll_t *)(ulong)(uint)server_fd;
          sVar3 = recv(server_fd,&stack0xffffffffffffffd4,5,0);
          iVar1 = (int)sVar3;
          if (iVar1 != -1) break;
          piVar4 = __errno_location();
          iVar2 = *piVar4;
          iVar1 = cli_rd_check;
          if (iVar2 != 4) goto LAB_001672fc;
        }
        if (iVar1 < 1) goto LAB_001672f5;
        if (iVar1 != 5) goto LAB_00167408;
        iVar1 = 2;
      } while (local_28 == 'd' && local_2c == 0x6c726f77);
      poll_cb_cold_8();
LAB_001672f5:
      piVar4 = __errno_location();
      iVar2 = *piVar4;
LAB_001672fc:
      if ((iVar2 != 0xb) && (iVar2 != 0x73)) goto LAB_0016740d;
      goto LAB_0016730a;
    }
  }
  poll_cb_cold_6();
LAB_00167408:
  poll_cb_cold_7();
LAB_0016740d:
  poll_cb_cold_9();
  uv_sleep(100);
  iVar1 = ticks;
  ticks = ticks + 1;
  if (8 < iVar1) {
    uv_poll_stop(poll_req);
    uv_poll_stop(0x3108d0);
    uv_close(&server_handle,0);
    uv_close(&client_handle,0);
    uv_close(&peer_handle,0);
    uv_close(handle,0);
    return;
  }
  return;
}

Assistant:

static void poll_cb(uv_fs_poll_t* handle,
                    int status,
                    const uv_stat_t* prev,
                    const uv_stat_t* curr) {
  uv_stat_t zero_statbuf;

  memset(&zero_statbuf, 0, sizeof(zero_statbuf));

  ASSERT(handle == &poll_handle);
  ASSERT(1 == uv_is_active((uv_handle_t*) handle));
  ASSERT(prev != NULL);
  ASSERT(curr != NULL);

  switch (poll_cb_called++) {
  case 0:
    ASSERT(status == UV_ENOENT);
    ASSERT(0 == memcmp(prev, &zero_statbuf, sizeof(zero_statbuf)));
    ASSERT(0 == memcmp(curr, &zero_statbuf, sizeof(zero_statbuf)));
    touch_file(FIXTURE);
    break;

  case 1:
    ASSERT(status == 0);
    ASSERT(0 == memcmp(prev, &zero_statbuf, sizeof(zero_statbuf)));
    ASSERT(0 != memcmp(curr, &zero_statbuf, sizeof(zero_statbuf)));
    ASSERT(0 == uv_timer_start(&timer_handle, timer_cb, 20, 0));
    break;

  case 2:
    ASSERT(status == 0);
    ASSERT(0 != memcmp(prev, &zero_statbuf, sizeof(zero_statbuf)));
    ASSERT(0 != memcmp(curr, &zero_statbuf, sizeof(zero_statbuf)));
    ASSERT(0 == uv_timer_start(&timer_handle, timer_cb, 200, 0));
    break;

  case 3:
    ASSERT(status == 0);
    ASSERT(0 != memcmp(prev, &zero_statbuf, sizeof(zero_statbuf)));
    ASSERT(0 != memcmp(curr, &zero_statbuf, sizeof(zero_statbuf)));
    remove(FIXTURE);
    break;

  case 4:
    ASSERT(status == UV_ENOENT);
    ASSERT(0 != memcmp(prev, &zero_statbuf, sizeof(zero_statbuf)));
    ASSERT(0 == memcmp(curr, &zero_statbuf, sizeof(zero_statbuf)));
    uv_close((uv_handle_t*)handle, close_cb);
    break;

  default:
    ASSERT(0);
  }
}